

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256-nistz_test.cc
# Opt level: O3

void __thiscall
P256NistzImplTest_TestVectors_Test::~P256NistzImplTest_TestVectors_Test
          (P256NistzImplTest_TestVectors_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(P256NistzImplTest, TestVectors) {
  return FileTestGTest("crypto/fipsmodule/ec/p256-nistz_tests.txt",
                       [&](FileTest *t) {
    if (t->GetParameter() == "Negate") {
      TestNegate(t, impl());
    } else if (t->GetParameter() == "MulMont") {
      TestMulMont(t, impl());
    } else if (t->GetParameter() == "PointAdd") {
      TestPointAdd(t, impl());
    } else if (t->GetParameter() == "OrdMulMont") {
      TestOrdMulMont(t, impl());
    } else {
      FAIL() << "Unknown test type:" << t->GetParameter();
    }
  });
}